

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec32.c
# Opt level: O3

void Hacl_Chacha20_Vec32_chacha20_decrypt_32
               (uint32_t len,uint8_t *out,uint8_t *cipher,uint8_t *key,uint8_t *n,uint32_t ctr)

{
  uint32_t x_1;
  uint uVar1;
  undefined4 in_register_0000003c;
  ulong uVar2;
  long lVar3;
  uint32_t k [16];
  uint32_t k_1 [16];
  uint local_108 [18];
  undefined8 local_c0;
  uint32_t local_b8 [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint32_t local_88;
  undefined8 local_84;
  undefined4 local_7c;
  uint local_78 [18];
  
  local_c0 = CONCAT44(in_register_0000003c,len);
  local_7c = *(undefined4 *)(n + 8);
  local_b8[0] = 0x61707865;
  local_b8[1] = 0x3320646e;
  local_b8[2] = 0x79622d32;
  local_b8[3] = 0x6b206574;
  local_a8 = *(undefined8 *)key;
  uStack_a0 = *(undefined8 *)(key + 8);
  local_98 = *(undefined8 *)(key + 0x10);
  uStack_90 = *(undefined8 *)(key + 0x18);
  local_84 = *(undefined8 *)n;
  local_88 = ctr;
  if (0x3f < len) {
    lVar3 = 0x3c;
    uVar2 = 0;
    do {
      local_108[0xc] = 0;
      local_108[0xd] = 0;
      local_108[0xe] = 0;
      local_108[0xf] = 0;
      local_108[8] = 0;
      local_108[9] = 0;
      local_108[10] = 0;
      local_108[0xb] = 0;
      local_108[4] = 0;
      local_108[5] = 0;
      local_108[6] = 0;
      local_108[7] = 0;
      local_108[0] = 0;
      local_108[1] = 0;
      local_108[2] = 0;
      local_108[3] = 0;
      chacha20_core_32(local_108,local_b8,(uint32_t)uVar2);
      *(uint *)(out + lVar3 + -0x3c) = local_108[0] ^ *(uint *)(cipher + lVar3 + -0x3c);
      *(uint *)(out + lVar3 + -0x38) = local_108[1] ^ *(uint *)(cipher + lVar3 + -0x38);
      *(uint *)(out + lVar3 + -0x34) = local_108[2] ^ *(uint *)(cipher + lVar3 + -0x34);
      *(uint *)(out + lVar3 + -0x30) = local_108[3] ^ *(uint *)(cipher + lVar3 + -0x30);
      *(uint *)(out + lVar3 + -0x2c) = local_108[4] ^ *(uint *)(cipher + lVar3 + -0x2c);
      *(uint *)(out + lVar3 + -0x28) = local_108[5] ^ *(uint *)(cipher + lVar3 + -0x28);
      *(uint *)(out + lVar3 + -0x24) = local_108[6] ^ *(uint *)(cipher + lVar3 + -0x24);
      *(uint *)(out + lVar3 + -0x20) = local_108[7] ^ *(uint *)(cipher + lVar3 + -0x20);
      *(uint *)(out + lVar3 + -0x1c) = local_108[8] ^ *(uint *)(cipher + lVar3 + -0x1c);
      *(uint *)(out + lVar3 + -0x18) = local_108[9] ^ *(uint *)(cipher + lVar3 + -0x18);
      *(uint *)(out + lVar3 + -0x14) = local_108[10] ^ *(uint *)(cipher + lVar3 + -0x14);
      *(uint *)(out + lVar3 + -0x10) = local_108[0xb] ^ *(uint *)(cipher + lVar3 + -0x10);
      *(uint *)(out + lVar3 + -0xc) = local_108[0xc] ^ *(uint *)(cipher + lVar3 + -0xc);
      *(uint *)(out + lVar3 + -8) = local_108[0xd] ^ *(uint *)(cipher + lVar3 + -8);
      *(uint *)(out + lVar3 + -4) = local_108[0xe] ^ *(uint *)(cipher + lVar3 + -4);
      *(uint *)(out + lVar3) = local_108[0xf] ^ *(uint *)(cipher + lVar3);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x40;
    } while (len >> 6 != uVar2);
  }
  if ((len & 0x3f) != 0) {
    uVar1 = (uint)local_c0 & 0xffffffc0;
    uVar2 = (ulong)(len & 0x3f);
    memset((void *)((long)local_108 + uVar2),0,0x40 - uVar2);
    memcpy(local_108,cipher + uVar1,uVar2);
    local_78[0xc] = 0;
    local_78[0xd] = 0;
    local_78[0xe] = 0;
    local_78[0xf] = 0;
    local_78[8] = 0;
    local_78[9] = 0;
    local_78[10] = 0;
    local_78[0xb] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[6] = 0;
    local_78[7] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    chacha20_core_32(local_78,local_b8,len >> 6);
    local_108[1] = local_78[1] ^ local_108[1];
    local_108[0] = local_78[0] ^ local_108[0];
    local_108[3] = local_78[3] ^ local_108[3];
    local_108[2] = local_78[2] ^ local_108[2];
    local_108[5] = local_78[5] ^ local_108[5];
    local_108[4] = local_78[4] ^ local_108[4];
    local_108[7] = local_78[7] ^ local_108[7];
    local_108[6] = local_78[6] ^ local_108[6];
    local_108[9] = local_78[9] ^ local_108[9];
    local_108[8] = local_78[8] ^ local_108[8];
    local_108[0xb] = local_78[0xb] ^ local_108[0xb];
    local_108[10] = local_78[10] ^ local_108[10];
    local_108[0xd] = local_78[0xd] ^ local_108[0xd];
    local_108[0xc] = local_78[0xc] ^ local_108[0xc];
    local_108[0xf] = local_78[0xf] ^ local_108[0xf];
    local_108[0xe] = local_78[0xe] ^ local_108[0xe];
    memcpy(out + uVar1,local_108,uVar2);
  }
  return;
}

Assistant:

void
Hacl_Chacha20_Vec32_chacha20_decrypt_32(
  uint32_t len,
  uint8_t *out,
  uint8_t *cipher,
  uint8_t *key,
  uint8_t *n,
  uint32_t ctr
)
{
  uint32_t ctx[16U] = { 0U };
  chacha20_init_32(ctx, key, n, ctr);
  uint32_t rem = len % 64U;
  uint32_t nb = len / 64U;
  uint32_t rem1 = len % 64U;
  for (uint32_t i0 = 0U; i0 < nb; i0++)
  {
    uint8_t *uu____0 = out + i0 * 64U;
    uint8_t *uu____1 = cipher + i0 * 64U;
    uint32_t k[16U] = { 0U };
    chacha20_core_32(k, ctx, i0);
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      uint32_t u = load32_le(uu____1 + i * 4U);
      uint32_t x = u;
      uint32_t y = x ^ k[i];
      store32_le(uu____0 + i * 4U, y););
  }
  if (rem1 > 0U)
  {
    uint8_t *uu____2 = out + nb * 64U;
    uint8_t plain[64U] = { 0U };
    memcpy(plain, cipher + nb * 64U, rem * sizeof (uint8_t));
    uint32_t k[16U] = { 0U };
    chacha20_core_32(k, ctx, nb);
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      uint32_t u = load32_le(plain + i * 4U);
      uint32_t x = u;
      uint32_t y = x ^ k[i];
      store32_le(plain + i * 4U, y););
    memcpy(uu____2, plain, rem * sizeof (uint8_t));
  }
}